

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_name.c
# Opt level: O3

monst * christen_monst(monst *mtmp,char *name)

{
  size_t sVar1;
  monst *mtmp2;
  long lVar2;
  monst *pmVar3;
  monst *pmVar4;
  char *__src;
  uint namelen;
  byte bVar5;
  char buf [63];
  char acStack_68 [62];
  undefined1 local_2a;
  
  bVar5 = 0;
  __src = acStack_68;
  if (*name == '\0') {
    namelen = 0;
    __src = name;
    if (mtmp->mnamelth == '\0') {
      return mtmp;
    }
  }
  else {
    sVar1 = strlen(name);
    namelen = (int)sVar1 + 1;
    if ((int)namelen < 0x40) {
      __src = name;
      if (namelen == mtmp->mnamelth) {
        if (namelen == 0) {
          return mtmp;
        }
        goto LAB_0017bfc6;
      }
    }
    else {
      strncpy(acStack_68,name,0x3e);
      local_2a = 0;
      namelen = 0x3f;
      name = acStack_68;
      if (mtmp->mnamelth == '?') {
LAB_0017bfc6:
        strcpy((char *)((long)(mtmp->mtrack + 0x18) + (long)mtmp->mxlth),name);
        return mtmp;
      }
    }
  }
  mtmp2 = newmonst((uint)mtmp->mxtyp,namelen);
  pmVar3 = mtmp;
  pmVar4 = mtmp2;
  for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
    pmVar4->nmon = pmVar3->nmon;
    pmVar3 = (monst *)((long)pmVar3 + (ulong)bVar5 * -0x10 + 8);
    pmVar4 = (monst *)((long)pmVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  memcpy(&mtmp2->field_0x74,&mtmp->field_0x74,(long)mtmp->mxlth);
  mtmp2->mnamelth = (uchar)namelen;
  if (namelen != 0) {
    strcpy(&mtmp2->field_0x74 + mtmp2->mxlth,__src);
  }
  replmon(mtmp,mtmp2);
  return mtmp2;
}

Assistant:

struct monst *christen_monst(struct monst *mtmp, const char *name)
{
	int lth;
	struct monst *mtmp2;
	char buf[PL_PSIZ];

	/* dogname & catname are PL_PSIZ arrays; object names have same limit */
	lth = *name ? (int)(strlen(name) + 1) : 0;
	if (lth > PL_PSIZ){
		lth = PL_PSIZ;
		name = strncpy(buf, name, PL_PSIZ - 1);
		buf[PL_PSIZ - 1] = '\0';
	}
	if (lth == mtmp->mnamelth) {
		/* don't need to allocate a new monst struct */
		if (lth) strcpy(NAME(mtmp), name);
		return mtmp;
	}
	mtmp2 = newmonst(mtmp->mxtyp, lth);
	*mtmp2 = *mtmp;
	memcpy(mtmp2->mextra, mtmp->mextra, mtmp->mxlth);
	mtmp2->mnamelth = lth;
	if (lth) strcpy(NAME(mtmp2), name);
	replmon(mtmp,mtmp2);
	return mtmp2;
}